

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieGia.c
# Opt level: O1

int Gia_ManFlattenLogicPrepare(Abc_Ntk_t *pNtk)

{
  long *plVar1;
  long lVar2;
  Vec_Ptr_t *pVVar3;
  long lVar4;
  
  Abc_NtkFillTemp(pNtk);
  pVVar3 = pNtk->vPis;
  if (0 < pVVar3->nSize) {
    lVar2 = 0;
    do {
      *(int *)((long)pVVar3->pArray[lVar2] + 0x38) = (int)lVar2;
      lVar2 = lVar2 + 1;
      pVVar3 = pNtk->vPis;
    } while (lVar2 < pVVar3->nSize);
  }
  pVVar3 = pNtk->vPos;
  if (0 < pVVar3->nSize) {
    lVar2 = 0;
    do {
      *(int *)((long)pVVar3->pArray[lVar2] + 0x38) = (int)lVar2;
      lVar2 = lVar2 + 1;
      pVVar3 = pNtk->vPos;
    } while (lVar2 < pVVar3->nSize);
  }
  pVVar3 = pNtk->vBoxes;
  if (0 < pVVar3->nSize) {
    lVar2 = 0;
    do {
      plVar1 = (long *)pVVar3->pArray[lVar2];
      if ((*(uint *)((long)plVar1 + 0x14) & 0xf) == 8) {
        __assert_fail("!Abc_ObjIsLatch(pBox)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieGia.c"
                      ,0x16e,"int Gia_ManFlattenLogicPrepare(Abc_Ntk_t *)");
      }
      if (0 < *(int *)((long)plVar1 + 0x1c)) {
        lVar4 = 0;
        do {
          *(int *)(*(long *)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                            (long)*(int *)(plVar1[4] + lVar4 * 4) * 8) + 0x38) = (int)lVar4;
          lVar4 = lVar4 + 1;
        } while (lVar4 < *(int *)((long)plVar1 + 0x1c));
      }
      if (0 < *(int *)((long)plVar1 + 0x2c)) {
        lVar4 = 0;
        do {
          *(int *)(*(long *)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                            (long)*(int *)(plVar1[6] + lVar4 * 4) * 8) + 0x38) = (int)lVar4;
          lVar4 = lVar4 + 1;
        } while (lVar4 < *(int *)((long)plVar1 + 0x2c));
      }
      lVar2 = lVar2 + 1;
      pVVar3 = pNtk->vBoxes;
    } while (lVar2 < pVVar3->nSize);
  }
  return pNtk->vPos->nSize + pNtk->vPis->nSize;
}

Assistant:

int Gia_ManFlattenLogicPrepare( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pTerm, * pBox; 
    int i, k;
    Abc_NtkFillTemp( pNtk );
    Abc_NtkForEachPi( pNtk, pTerm, i )
        pTerm->iData = i;
    Abc_NtkForEachPo( pNtk, pTerm, i )
        pTerm->iData = i;
    Abc_NtkForEachBox( pNtk, pBox, i )
    {
        assert( !Abc_ObjIsLatch(pBox) );
        Abc_ObjForEachFanin( pBox, pTerm, k )
            pTerm->iData = k;
        Abc_ObjForEachFanout( pBox, pTerm, k )
            pTerm->iData = k;
    }
    return Abc_NtkPiNum(pNtk) + Abc_NtkPoNum(pNtk);
}